

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  ulong uVar8;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar11;
  undefined1 auVar10 [56];
  
  pIVar6 = GImGui;
  auVar10 = in_ZMM0._8_56_;
  if (GImGui->ActiveId != 0) {
    return;
  }
  if (GImGui->HoveredId != 0) {
    return;
  }
  pIVar7 = GImGui->NavWindow;
  if ((pIVar7 != (ImGuiWindow *)0x0) && (pIVar7->Appearing != false)) {
    return;
  }
  if ((GImGui->IO).MouseClicked[0] == true) {
    if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
      if ((pIVar7 != (ImGuiWindow *)0x0) &&
         (pIVar7 = GetTopMostPopupModal(), pIVar7 == (ImGuiWindow *)0x0)) {
        FocusWindow((ImGuiWindow *)0x0);
      }
    }
    else {
      StartMouseMovingWindow(GImGui->HoveredWindow);
      if (((pIVar6->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
         ((pIVar6->HoveredRootWindow->Flags & 1) == 0)) {
        IVar11 = ImGuiWindow::TitleBarRect(pIVar6->HoveredRootWindow);
        auVar9._0_8_ = IVar11.Min;
        auVar9._8_56_ = auVar10;
        fVar1 = (pIVar6->IO).MouseClickedPos[0].x;
        if (IVar11.Min.x <= fVar1) {
          fVar2 = (pIVar6->IO).MouseClickedPos[0].y;
          auVar4 = vmovshdup_avx(auVar9._0_16_);
          if (((auVar4._0_4_ <= fVar2) && (fVar1 < IVar11.Max.x)) &&
             (auVar4._8_8_ = in_XMM1_Qb, auVar4._0_4_ = IVar11.Max.x, auVar4._4_4_ = IVar11.Max.y,
             auVar4 = vmovshdup_avx(auVar4), fVar2 < auVar4._0_4_)) goto LAB_002297a3;
        }
        pIVar6->MovingWindow = (ImGuiWindow *)0x0;
      }
    }
  }
LAB_002297a3:
  if ((pIVar6->IO).MouseClicked[1] != true) {
    return;
  }
  pIVar7 = GetTopMostPopupModal();
  uVar8 = (ulong)(pIVar6->Windows).Size;
  if ((long)uVar8 < 1 || pIVar7 == (ImGuiWindow *)0x0) {
    if (pIVar7 != (ImGuiWindow *)0x0) goto LAB_0022981b;
  }
  else {
    bVar5 = false;
    while (pIVar3 = (pIVar6->Windows).Data[uVar8 - 1], pIVar3 != pIVar7) {
      if (pIVar3 == pIVar6->HoveredWindow) {
        bVar5 = true;
      }
      if ((uVar8 < 2) || (uVar8 = uVar8 - 1, bVar5)) break;
    }
    if (!bVar5) goto LAB_0022981b;
  }
  pIVar7 = pIVar6->HoveredWindow;
LAB_0022981b:
  ClosePopupsOverWindow(pIVar7,true);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}